

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O1

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint_TTDWbpId
          (DebugDocument *this,int64 bpId,StatementLocation statement)

{
  int iVar1;
  ScriptContext *this_00;
  ArenaAllocator *alloc;
  BreakpointProbe *this_01;
  DebugContext *pDVar2;
  BreakpointProbeList *this_02;
  
  this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
  alloc = ScriptContext::AllocatorForDiagnostics(this_00);
  this_01 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
  BreakpointProbe::BreakpointProbe(this_01,this,&statement,(int)bpId);
  pDVar2 = ScriptContext::GetDebugContext(this_00);
  ProbeContainer::AddProbe(pDVar2->diagProbesContainer,(Probe *)this_01);
  this_02 = GetBreakpointList(this);
  JsUtil::
  List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_02,0);
  iVar1 = (this_02->
          super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  (this_02->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer[iVar1] = this_01;
  (this_02->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = iVar1 + 1;
  return this_01;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint_TTDWbpId(int64 bpId, StatementLocation statement)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement, (uint32)bpId);

        scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
        BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
        pBreakpointList->Add(pProbe);
        return pProbe;
    }